

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c.c
# Opt level: O0

void free_context(s98c *ctx)

{
  int local_14;
  int i;
  s98c *ctx_local;
  
  if (ctx->devices != (s98deviceinfo *)0x0) {
    free(ctx->devices);
  }
  if (ctx->tags != (s98taginfo *)0x0) {
    for (local_14 = 0; (ulong)(long)local_14 < ctx->tags_count; local_14 = local_14 + 1) {
      free(ctx->tags[local_14].key);
      free(ctx->tags[local_14].value);
    }
    free(ctx->tags);
  }
  if (ctx->dump_buffer != (uint8_t *)0x0) {
    free(ctx->dump_buffer);
  }
  if (ctx->source_encoding != (char *)0x0) {
    free(ctx->source_encoding);
  }
  return;
}

Assistant:

void free_context(struct s98c* ctx)
{
    if(ctx->devices != NULL) {
        free(ctx->devices);
    }
    if(ctx->tags != NULL) {
        int i;
        for(i = 0; i < ctx->tags_count; i++) {
            free(ctx->tags[i].key);
            free(ctx->tags[i].value);
        }
        free(ctx->tags);
    }
    if(ctx->dump_buffer != NULL) {
        free(ctx->dump_buffer);
    }
    if(ctx->source_encoding != NULL) {
        free(ctx->source_encoding);
    }
}